

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcRobustBufferAccessBehaviorTests.cpp
# Opt level: O1

bool __thiscall
deqp::RobustBufferAccessBehavior::StorageBufferTest::verifyResults
          (StorageBufferTest *this,GLfloat *buffer_data)

{
  ostringstream *this_00;
  char *__s;
  ulong uVar1;
  size_t sVar2;
  TestError *this_01;
  long lVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  undefined1 local_1a0 [120];
  ios_base local_128 [264];
  
  uVar1 = (ulong)this->m_test_case;
  if (uVar1 < 3) {
    lVar3 = (long)*(int *)(&DAT_01bc68f0 + uVar1 * 4);
    auVar5[0] = -(*(char *)buffer_data == (&DAT_01bc68f0)[lVar3]);
    auVar5[1] = -(*(char *)((long)buffer_data + 1) == (&UNK_01bc68f1)[lVar3]);
    auVar5[2] = -(*(char *)((long)buffer_data + 2) == (&UNK_01bc68f2)[lVar3]);
    auVar5[3] = -(*(char *)((long)buffer_data + 3) == (&UNK_01bc68f3)[lVar3]);
    auVar5[4] = -(*(char *)(buffer_data + 1) == (&UNK_01bc68f4)[lVar3]);
    auVar5[5] = -(*(char *)((long)buffer_data + 5) == (&UNK_01bc68f5)[lVar3]);
    auVar5[6] = -(*(char *)((long)buffer_data + 6) == (&UNK_01bc68f6)[lVar3]);
    auVar5[7] = -(*(char *)((long)buffer_data + 7) == (&UNK_01bc68f7)[lVar3]);
    auVar5[8] = -(*(char *)(buffer_data + 2) == (&UNK_01bc68f8)[lVar3]);
    auVar5[9] = -(*(char *)((long)buffer_data + 9) == (&UNK_01bc68f9)[lVar3]);
    auVar5[10] = -(*(char *)((long)buffer_data + 10) == (&UNK_01bc68fa)[lVar3]);
    auVar5[0xb] = -(*(char *)((long)buffer_data + 0xb) == (&UNK_01bc68fb)[lVar3]);
    auVar5[0xc] = -(*(char *)(buffer_data + 3) ==
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                   [lVar3]);
    auVar5[0xd] = -(*(char *)((long)buffer_data + 0xd) ==
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                   [lVar3 + 1]);
    auVar5[0xe] = -(*(char *)((long)buffer_data + 0xe) ==
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                   [lVar3 + 2]);
    auVar5[0xf] = -(*(char *)((long)buffer_data + 0xf) ==
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                   [lVar3 + 3]);
    bVar4 = (ushort)((ushort)(SUB161(auVar5 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar5 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar5 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar5 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar5 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar5 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar5 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar5 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar5 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar5 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar5 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar5 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar5 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar5 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar5 >> 0x77,0) & 1) << 0xe |
                    (ushort)(auVar5[0xf] >> 7) << 0xf) == 0xffff;
    if (!bVar4) {
      __s = (&PTR_anon_var_dwarf_f2934c_0215c318)[uVar1];
      local_1a0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
      this_00 = (ostringstream *)(local_1a0 + 8);
      std::__cxx11::ostringstream::ostringstream(this_00);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"Test case: ",0xb);
      sVar2 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,__s,sVar2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," failed",7);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(this_00);
      std::ios_base::~ios_base(local_128);
    }
    return bVar4;
  }
  this_01 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_01,"Invalid enum",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
             ,0xd8b);
  __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

bool StorageBufferTest::verifyResults(GLfloat* buffer_data)
{
	static const GLfloat expected_data_valid[4]				  = { 2.0f, 3.0f, 4.0f, 5.0f };
	static const GLfloat expected_data_invalid_destination[4] = { 1.0f, 1.0f, 1.0f, 1.0f };
	static const GLfloat expected_data_invalid_source[4]	  = { 0.0f, 0.0f, 0.0f, 0.0f };

	int size = static_cast<int>(sizeof(GLfloat) * 4);

	/* Prepare expected data const for proper case*/
	const GLfloat* expected_data = 0;
	const GLchar*  name			 = 0;
	switch (m_test_case)
	{
	case VALID:
		expected_data = expected_data_valid;
		name		  = "valid indices";
		break;
	case SOURCE_INVALID:
		expected_data = expected_data_invalid_source;
		name		  = "invalid source indices";
		break;
	case DESTINATION_INVALID:
		expected_data = expected_data_invalid_destination;
		name		  = "invalid destination indices";
		break;
	default:
		TCU_FAIL("Invalid enum");
	}

	/* Verify buffer data */
	if (0 != memcmp(expected_data, buffer_data, size))
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message << "Test case: " << name << " failed"
											<< tcu::TestLog::EndMessage;
		return false;
	}

	return true;
}